

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O3

bool __thiscall kj::_::GlobFilter::matches(GlobFilter *this,StringPtr name)

{
  Vector<unsigned_int> *this_00;
  char c;
  uint *puVar1;
  uint *puVar2;
  size_t sVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  ulong uVar7;
  uint *target;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  uint *__end3;
  char *pcVar11;
  ulong uVar12;
  GlobFilter *pGVar13;
  uint uVar14;
  uint *ptrCopy;
  uint *puVar15;
  bool bVar16;
  Vector<unsigned_int> scratch;
  ArrayBuilder<unsigned_int> local_88;
  uint *local_68;
  char *local_60;
  GlobFilter *local_58;
  uint *local_50;
  uint *local_48;
  uint *local_40;
  GlobFilter *local_38;
  
  pcVar11 = name.content.ptr;
  this_00 = &this->states;
  puVar9 = (this->states).builder.ptr;
  (this->states).builder.pos = puVar9;
  pGVar13 = this;
  if (puVar9 == (this->states).builder.endPtr) {
    pGVar13 = (GlobFilter *)this_00;
    Vector<unsigned_int>::setCapacity(this_00,4);
    puVar9 = (this->states).builder.pos;
  }
  *puVar9 = 0;
  puVar9 = puVar9 + 1;
  (this->states).builder.pos = puVar9;
  local_88.ptr = (uint *)0x0;
  local_88.pos = (uint *)0x0;
  local_88.endPtr = (uint *)0x0;
  local_60 = pcVar11 + (name.content.size_ - 1);
  if (local_60 == pcVar11) {
    puVar15 = (uint *)0x0;
  }
  else {
    do {
      c = *pcVar11;
      puVar9 = (this->states).builder.ptr;
      puVar10 = (this->states).builder.pos;
      puVar1 = (this->states).builder.endPtr;
      local_58 = (GlobFilter *)(this->states).builder.disposer;
      (this_00->builder).ptr = (uint *)0x0;
      (this->states).builder.pos = (RemoveConst<unsigned_int> *)0x0;
      (this->states).builder.endPtr = (uint *)0x0;
      local_50 = puVar9;
      local_48 = puVar10;
      local_40 = puVar1;
      local_38 = local_58;
      ArrayBuilder<unsigned_int>::operator=(&this_00->builder,&local_88);
      puVar8 = (this->states).builder.ptr;
      puVar2 = (this->states).builder.endPtr;
      (this->states).builder.pos = puVar8;
      if ((c == '\\') ||
         (puVar4 = local_88.ptr, puVar5 = local_88.pos, puVar6 = local_88.endPtr, puVar15 = puVar9,
         c == '/')) {
        local_68 = puVar9;
        if (puVar8 == puVar2) {
          Vector<unsigned_int>::setCapacity(this_00,4);
          puVar8 = (this->states).builder.pos;
        }
        *puVar8 = 0;
        (this->states).builder.pos = puVar8 + 1;
        puVar4 = local_88.ptr;
        puVar5 = local_88.pos;
        puVar6 = local_88.endPtr;
        puVar9 = local_68;
        puVar15 = local_68;
      }
      for (; local_68 = puVar15, puVar9 != puVar10; puVar9 = puVar9 + 1) {
        local_88.ptr = puVar4;
        local_88.pos = puVar5;
        local_88.endPtr = puVar6;
        applyState(this,c,*puVar9);
        puVar4 = local_88.ptr;
        puVar5 = local_88.pos;
        puVar6 = local_88.endPtr;
        puVar15 = local_68;
      }
      if (puVar4 != (uint *)0x0) {
        local_88.ptr = (uint *)0x0;
        local_88.pos = (RemoveConst<unsigned_int> *)0x0;
        local_88.endPtr = (uint *)0x0;
        (**(code **)(((GlobFilter *)local_88.disposer)->pattern).content.ptr)
                  (local_88.disposer,puVar4,4,(long)puVar5 - (long)puVar4 >> 2,
                   (long)puVar6 - (long)puVar4 >> 2,0);
      }
      local_88.disposer = (ArrayDisposer *)local_58;
      pcVar11 = pcVar11 + 1;
      local_88.ptr = puVar15;
      local_88.pos = puVar10;
      local_88.endPtr = puVar1;
    } while (pcVar11 != local_60);
    puVar9 = (this->states).builder.pos;
    pGVar13 = local_58;
  }
  puVar10 = (this_00->builder).ptr;
  if (puVar10 == puVar9) {
    bVar16 = false;
  }
  else {
    sVar3 = (this->pattern).content.size_;
    uVar12 = 0;
    if (sVar3 != 0) {
      uVar12 = sVar3 - 1;
    }
    do {
      uVar14 = *puVar10;
      do {
        uVar7 = (ulong)uVar14;
        if (uVar12 <= uVar7) break;
        uVar14 = uVar14 + 1;
      } while ((this->pattern).content.ptr[uVar7] == '*');
      bVar16 = uVar12 == uVar7;
    } while ((!bVar16) && (puVar10 = puVar10 + 1, puVar10 != puVar9));
  }
  if (puVar15 != (uint *)0x0) {
    local_88.ptr = (uint *)0x0;
    local_88.pos = (RemoveConst<unsigned_int> *)0x0;
    local_88.endPtr = (uint *)0x0;
    (**(code **)(pGVar13->pattern).content.ptr)();
  }
  return bVar16;
}

Assistant:

bool GlobFilter::matches(StringPtr name) {
  // Get out your computer science books. We're implementing a non-deterministic finite automaton.
  //
  // Our NDFA has one "state" corresponding to each character in the pattern.
  //
  // As you may recall, an NDFA can be transformed into a DFA where every state in the DFA
  // represents some combination of states in the NDFA. Therefore, we actually have to store a
  // list of states here. (Actually, what we really want is a set of states, but because our
  // patterns are mostly non-cyclic a list of states should work fine and be a bit more efficient.)

  // Our state list starts out pointing only at the start of the pattern.
  states.resize(0);
  states.add(0);

  Vector<uint> scratch;

  // Iterate through each character in the name.
  for (char c: name) {
    // Pull the current set of states off to the side, so that we can populate `states` with the
    // new set of states.
    Vector<uint> oldStates = kj::mv(states);
    states = kj::mv(scratch);
    states.resize(0);

    // The pattern can omit a leading path. So if we're at a '/' then enter the state machine at
    // the beginning on the next char.
    if (c == '/' || c == '\\') {
      states.add(0);
    }

    // Process each state.
    for (uint state: oldStates) {
      applyState(c, state);
    }

    // Store the previous state vector for reuse.
    scratch = kj::mv(oldStates);
  }

  // If any one state is at the end of the pattern (or at a wildcard just before the end of the
  // pattern), we have a match.
  for (uint state: states) {
    while (state < pattern.size() && pattern[state] == '*') {
      ++state;
    }
    if (state == pattern.size()) {
      return true;
    }
  }
  return false;
}